

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_open(Curl_easy **curl)

{
  int *piVar1;
  Curl_easy *data;
  char *pcVar2;
  CURLcode CVar3;
  
  data = (Curl_easy *)(*Curl_ccalloc)(1,0x4e28);
  CVar3 = CURLE_OUT_OF_MEMORY;
  if (data != (Curl_easy *)0x0) {
    data->magic = 0xc0dedbad;
    pcVar2 = (char *)(*Curl_cmalloc)(0x4001);
    (data->state).buffer = pcVar2;
    pcVar2 = (char *)(*Curl_cmalloc)(0x100);
    (data->state).headerbuff = pcVar2;
    if (pcVar2 == (char *)0x0) {
      (*Curl_cfree)((data->state).buffer);
      (*Curl_cfree)((data->state).headerbuff);
      Curl_freeset(data);
      (*Curl_cfree)(data);
    }
    else {
      Curl_init_userdefined(&data->set);
      (data->state).headersize = 0x100;
      Curl_initinfo(data);
      CVar3 = CURLE_OK;
      (data->state).lastconnect = (connectdata *)0x0;
      piVar1 = &(data->progress).flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x10;
      (data->state).current_speed = -1;
      (data->wildcard).state = CURLWC_INIT;
      (data->wildcard).filelist = (curl_llist *)0x0;
      (data->set).fnmatch = (curl_fnmatch_callback)0x0;
      (data->set).maxconnects = 5;
      *curl = data;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_open(struct Curl_easy **curl)
{
  CURLcode result;
  struct Curl_easy *data;

  /* Very simple start-up: alloc the struct, init it with zeroes and return */
  data = calloc(1, sizeof(struct Curl_easy));
  if(!data) {
    /* this is a very serious error */
    DEBUGF(fprintf(stderr, "Error: calloc of Curl_easy failed\n"));
    return CURLE_OUT_OF_MEMORY;
  }

  data->magic = CURLEASY_MAGIC_NUMBER;

  result = Curl_resolver_init(&data->state.resolver);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: resolver_init failed\n"));
    free(data);
    return result;
  }

  /* We do some initial setup here, all those fields that can't be just 0 */

  data->state.buffer = malloc(BUFSIZE + 1);
  if(!data->state.buffer) {
    DEBUGF(fprintf(stderr, "Error: malloc of buffer failed\n"));
    result = CURLE_OUT_OF_MEMORY;
  }

  data->state.headerbuff = malloc(HEADERSIZE);
  if(!data->state.headerbuff) {
    DEBUGF(fprintf(stderr, "Error: malloc of headerbuff failed\n"));
    result = CURLE_OUT_OF_MEMORY;
  }
  else {
    result = Curl_init_userdefined(&data->set);

    data->state.headersize=HEADERSIZE;

    Curl_convert_init(data);

    Curl_initinfo(data);

    /* most recent connection is not yet defined */
    data->state.lastconnect = NULL;

    data->progress.flags |= PGRS_HIDE;
    data->state.current_speed = -1; /* init to negative == impossible */

    data->wildcard.state = CURLWC_INIT;
    data->wildcard.filelist = NULL;
    data->set.fnmatch = ZERO_NULL;
    data->set.maxconnects = DEFAULT_CONNCACHE_SIZE; /* for easy handles */

    Curl_http2_init_state(&data->state);
  }

  if(result) {
    Curl_resolver_cleanup(data->state.resolver);
    free(data->state.buffer);
    free(data->state.headerbuff);
    Curl_freeset(data);
    free(data);
    data = NULL;
  }
  else
    *curl = data;

  return result;
}